

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Expression
dynet::detail::
f<dynet::Concatenate,std::vector<dynet::Expression,std::allocator<dynet::Expression>>,unsigned_int>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs,uint *arg1)

{
  uint uVar1;
  undefined4 uVar2;
  vector<dynet::Node*,std::allocator<dynet::Node*>> *this;
  pointer pEVar3;
  iterator __position;
  undefined4 uVar4;
  pointer pEVar5;
  Node *pNVar6;
  long lVar7;
  VariableIndex *pVVar8;
  Expression EVar9;
  VariableIndex new_node_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_45;
  undefined4 local_44;
  Node *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  pEVar5 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = (vector<dynet::Node*,std::allocator<dynet::Node*>> *)pEVar5->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,
             (long)(xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 4,
             (allocator_type *)&local_40);
  pEVar3 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar8 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pEVar5 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar3; pEVar5 = pEVar5 + 1) {
    *pVVar8 = pEVar5->i;
    pVVar8 = pVVar8 + 1;
  }
  local_44 = (undefined4)((ulong)(*(long *)(this + 8) - *(long *)this) >> 3);
  pNVar6 = (Node *)operator_new(0x80);
  uVar1 = *arg1;
  *(undefined **)pNVar6 = &std::bad_cast::typeinfo;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)(pNVar6 + 8),
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_45);
  *(undefined8 *)(pNVar6 + 0x3c) = 0x100000000;
  *(undefined8 *)(pNVar6 + 0x48) = 0;
  *(code **)pNVar6 = std::ios_base::Init::~Init;
  *(undefined8 *)(pNVar6 + 0x60) = 0;
  *(undefined8 *)(pNVar6 + 0x68) = 0;
  *(undefined8 *)(pNVar6 + 0x70) = 0;
  *(uint *)(pNVar6 + 0x78) = uVar1;
  __position._M_current = *(Node ***)(this + 8);
  local_40 = pNVar6;
  if (__position._M_current == *(Node ***)(this + 0x10)) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              (this,__position,&local_40);
    lVar7 = *(long *)(this + 8);
  }
  else {
    *__position._M_current = pNVar6;
    lVar7 = *(long *)(this + 8) + 8;
    *(long *)(this + 8) = lVar7;
  }
  *(undefined8 *)(*(long *)(lVar7 + -8) + 0x48) = default_device;
  dynet::ComputationGraph::set_dim_for_new_node((uint *)this);
  uVar4 = local_44;
  uVar2 = *(undefined4 *)(this + 0x38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  EVar9.graph_id = uVar2;
  EVar9.i = uVar4;
  EVar9.pg = (ComputationGraph *)this;
  return EVar9;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}